

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

mfcc_t *** feat_array_alloc(feat_t *fcb,int32 nfr)

{
  int iVar1;
  mfcc_t ***pppmVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  int32 iVar9;
  uint32 *puVar10;
  uint uVar11;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x169,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (nfr < 1) {
    __assert_fail("nfr > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x16a,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (fcb->out_dim == 0) {
    __assert_fail("feat_dimension(fcb) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x16b,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  iVar1 = fcb->n_stream;
  if ((long)iVar1 < 1) {
    uVar11 = 0;
  }
  else {
    lVar4 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + fcb->stream_len[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if (uVar11 < fcb->out_dim) {
    __assert_fail("k >= feat_dimension(fcb)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x172,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if ((int)uVar11 < fcb->sv_dim) {
    __assert_fail("k >= fcb->sv_dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x173,"mfcc_t ***feat_array_alloc(feat_t *, int32)");
  }
  if (fcb->n_sv != 0) {
    iVar1 = fcb->n_sv;
  }
  pppmVar2 = (mfcc_t ***)
             __ckd_calloc_2d__((ulong)(uint)nfr,(long)iVar1,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                               ,0x176);
  pvVar3 = __ckd_calloc__((long)(int)(uVar11 * nfr),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                          ,0x177);
  iVar1 = fcb->n_sv;
  uVar5 = 1;
  if (1 < nfr) {
    uVar5 = (ulong)(uint)nfr;
  }
  uVar6 = 0;
  do {
    pvVar7 = (void *)((long)pvVar3 + uVar6 * (long)(int)uVar11 * 4);
    lVar4 = 0;
    lVar8 = 0;
    while( true ) {
      iVar9 = iVar1;
      if (iVar1 == 0) {
        iVar9 = fcb->n_stream;
      }
      if (iVar9 <= lVar8) break;
      *(void **)((long)pppmVar2[uVar6] + lVar4 * 2) = pvVar7;
      puVar10 = &fcb->out_dim;
      if (fcb->lda == (mfcc_t ***)0x0) {
        if (fcb->sv_len == (uint32 *)0x0) {
          puVar10 = (uint32 *)((long)fcb->stream_len + lVar4);
        }
        else {
          puVar10 = fcb->sv_len + lVar8;
        }
      }
      pvVar7 = (void *)((long)pvVar7 + (ulong)*puVar10 * 4);
      lVar8 = lVar8 + 1;
      lVar4 = lVar4 + 4;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != uVar5);
  return pppmVar2;
}

Assistant:

mfcc_t ***
feat_array_alloc(feat_t * fcb, int32 nfr)
{
    int32 i, j, k;
    mfcc_t *data, *d, ***feat;

    assert(fcb);
    assert(nfr > 0);
    assert(feat_dimension(fcb) > 0);

    /* Make sure to use the dimensionality of the features *before*
       LDA and subvector projection. */
    k = 0;
    for (i = 0; i < fcb->n_stream; ++i)
        k += fcb->stream_len[i];
    assert(k >= feat_dimension(fcb));
    assert(k >= fcb->sv_dim);

    feat =
        (mfcc_t ***) ckd_calloc_2d(nfr, feat_dimension1(fcb), sizeof(mfcc_t *));
    data = (mfcc_t *) ckd_calloc(nfr * k, sizeof(mfcc_t));

    for (i = 0; i < nfr; i++) {
        d = data + i * k;
        for (j = 0; j < feat_dimension1(fcb); j++) {
            feat[i][j] = d;
            d += feat_dimension2(fcb, j);
        }
    }

    return feat;
}